

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  cmCTestUpdateHandler *this_00;
  cmCTestConfigureHandler *pcVar4;
  cmCTestBuildHandler *pcVar5;
  cmCTestTestHandler *pcVar6;
  cmCTestCoverageHandler *pcVar7;
  cmCTestMemCheckHandler *pcVar8;
  ulong uVar9;
  cmCTestSubmitHandler *pcVar10;
  ostream *this_01;
  char *pcVar11;
  bool local_37d;
  bool local_37c;
  bool local_37b;
  bool local_37a;
  bool local_379;
  bool local_35a;
  string local_350 [32];
  ostringstream local_330 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [8];
  string fullname;
  char *file;
  unsigned_long kk;
  Directory d;
  string notes_dir;
  duration<long,_std::ratio<60L,_1L>_> local_138;
  duration<double,_std::ratio<1L,_1L>_> local_130;
  int local_124;
  duration<long,_std::ratio<60L,_1L>_> local_120;
  duration<double,_std::ratio<1L,_1L>_> local_118;
  int local_10c;
  duration<long,_std::ratio<60L,_1L>_> local_108;
  duration<double,_std::ratio<1L,_1L>_> local_100;
  int local_f4;
  duration<long,_std::ratio<60L,_1L>_> local_f0;
  duration<double,_std::ratio<1L,_1L>_> local_e8;
  int local_dc;
  duration<long,_std::ratio<60L,_1L>_> local_d8;
  duration<double,_std::ratio<1L,_1L>_> local_d0;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  cmCTestUpdateHandler *local_48;
  cmCTestUpdateHandler *uphandler;
  duration<long,_std::ratio<60L,_1L>_> local_38;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  uint local_28;
  int local_24;
  Part p;
  int update_count;
  bool notest;
  cmCTest *pcStack_18;
  int res;
  cmCTest *this_local;
  
  update_count = 0;
  local_24 = 0;
  local_28 = 0;
  p._3_1_ = 1;
  pcStack_18 = this;
  while (p._3_1_ != PartStart >> 0x18 && local_28 != 0xc) {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + local_28);
    local_28 = local_28 + 1;
    p._3_1_ = (bVar1 ^ 0xff) & 1;
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 1);
  local_35a = false;
  if (bVar1) {
    local_30.__r = (rep_conflict)GetRemainingTimeAllowed(this);
    uphandler._4_4_ = 2;
    std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
              ((duration<long,std::ratio<60l,1l>> *)&local_38,(int *)((long)&uphandler + 4));
    local_35a = std::chrono::operator>(&local_30,&local_38);
  }
  if (local_35a != false) {
    this_00 = GetUpdateHandler(this);
    local_48 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"SourceDirectory",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"SourceDirectory",&local_c1);
    GetCTestConfiguration(&local_a0,this,&local_c0);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption
              (&this_00->super_cmCTestGenericHandler,&local_68,pcVar11);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    local_24 = (*(local_48->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
    if (local_24 < 0) {
      update_count = update_count | 1;
    }
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar3->TestModel == 2) && (local_24 == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 2);
    local_379 = false;
    if (bVar1) {
      local_d0.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_dc = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_d8,&local_dc);
      local_379 = std::chrono::operator>(&local_d0,&local_d8);
    }
    if (local_379 != false) {
      pcVar4 = GetConfigureHandler(this);
      iVar2 = (*(pcVar4->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 2;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 3);
    local_37a = false;
    if (bVar1) {
      local_e8.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_f4 = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_f0,&local_f4);
      local_37a = std::chrono::operator>(&local_e8,&local_f0);
    }
    if (local_37a != false) {
      UpdateCTestConfiguration(this);
      pcVar5 = GetBuildHandler(this);
      iVar2 = (*(pcVar5->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 4;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 4);
    if ((bVar1) || (local_37b = false, (p._3_1_ & 1) != PartStart >> 0x18)) {
      local_100.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_10c = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_108,&local_10c);
      local_37b = std::chrono::operator>(&local_100,&local_108);
    }
    if (local_37b != false) {
      UpdateCTestConfiguration(this);
      pcVar6 = GetTestHandler(this);
      iVar2 = (*(pcVar6->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 8;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 5);
    local_37c = false;
    if (bVar1) {
      local_118.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      local_124 = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_120,&local_124);
      local_37c = std::chrono::operator>(&local_118,&local_120);
    }
    if (local_37c != false) {
      UpdateCTestConfiguration(this);
      pcVar7 = GetCoverageHandler(this);
      iVar2 = (*(pcVar7->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 0x20;
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 6);
    local_37d = false;
    if (bVar1) {
      local_130.__r = (rep_conflict)GetRemainingTimeAllowed(this);
      notes_dir.field_2._12_4_ = 2;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_138,
                 (int *)(notes_dir.field_2._M_local_buf + 0xc));
      local_37d = std::chrono::operator>(&local_130,&local_138);
    }
    if (local_37d != false) {
      UpdateCTestConfiguration(this);
      pcVar8 = GetMemCheckHandler(this);
      iVar2 = (*(pcVar8->super_cmCTestTestHandler).super_cmCTestGenericHandler.
                _vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 0x10;
      }
    }
    if ((p._3_1_ & 1) == PartStart >> 0x18) {
      pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                     &pPVar3->BinaryDir,"/Testing/Notes");
      bVar1 = cmsys::SystemTools::FileIsDirectory
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d);
      if (bVar1) {
        cmsys::Directory::Directory((Directory *)&kk);
        cmsys::Directory::Load((Directory *)&kk,(string *)&d);
        for (file = (char *)0x0;
            pcVar11 = (char *)cmsys::Directory::GetNumberOfFiles((Directory *)&kk), file < pcVar11;
            file = file + 1) {
          fullname.field_2._8_8_ = cmsys::Directory::GetFile((Directory *)&kk,(unsigned_long)file);
          std::operator+(&local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,"/"
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,&local_1b8,(char *)fullname.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_1b8);
          bVar1 = cmsys::SystemTools::FileExists((string *)local_198);
          if ((bVar1) && (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_198), !bVar1))
          {
            std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                      (&this->Impl);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                       operator->(&this->Impl);
              std::__cxx11::string::operator+=((string *)&pPVar3->NotesFiles,";");
            }
            pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            std::__cxx11::string::operator+=((string *)&pPVar3->NotesFiles,(string *)local_198);
            pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            Private::PartInfo::Enable(pPVar3->Parts + 8);
          }
          std::__cxx11::string::~string((string *)local_198);
        }
        cmsys::Directory::~Directory((Directory *)&kk);
      }
      std::__cxx11::string::~string((string *)&d);
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 8);
    if (bVar1) {
      UpdateCTestConfiguration(this);
      std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                (&this->Impl);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                  (&this->Impl);
        pcVar11 = (char *)std::__cxx11::string::c_str();
        GenerateNotesFile(this,pcVar11);
      }
    }
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    bVar1 = Private::PartInfo::operator_cast_to_bool(pPVar3->Parts + 7);
    if (bVar1) {
      UpdateCTestConfiguration(this);
      pcVar10 = GetSubmitHandler(this);
      iVar2 = (*(pcVar10->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
      if (iVar2 < 0) {
        update_count = update_count | 0x40;
      }
    }
    if (update_count != 0) {
      std::__cxx11::ostringstream::ostringstream(local_330);
      this_01 = std::operator<<((ostream *)local_330,"Errors while running CTest");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar11 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
          ,0x3f8,pcVar11,false);
      std::__cxx11::string::~string(local_350);
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
    this_local._4_4_ = update_count;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount; p = Part(p + 1)) {
    notest = !this->Impl->Parts[p];
  }
  if (this->Impl->Parts[PartUpdate] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    cmCTestUpdateHandler* uphandler = this->GetUpdateHandler();
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->Impl->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Impl->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    if (this->GetConfigureHandler()->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartBuild] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetBuildHandler()->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Impl->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetTestHandler()->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Impl->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetCoverageHandler()->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetMemCheckHandler()->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->Impl->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->Impl->NotesFiles.empty()) {
            this->Impl->NotesFiles += ";";
          }
          this->Impl->NotesFiles += fullname;
          this->Impl->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Impl->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->Impl->NotesFiles.empty()) {
      this->GenerateNotesFile(this->Impl->NotesFiles.c_str());
    }
  }
  if (this->Impl->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetSubmitHandler()->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
  }
  return res;
}